

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

sunrealtype N_VMin_SensWrapper(N_Vector x)

{
  long *in_RDI;
  sunrealtype tmp;
  sunrealtype min;
  int i;
  N_Vector in_stack_ffffffffffffffe0;
  undefined8 local_18;
  undefined4 local_c;
  
  local_18 = (N_Vector)N_VMin(in_stack_ffffffffffffffe0);
  for (local_c = 1; local_c < *(int *)(*in_RDI + 8); local_c = local_c + 1) {
    in_stack_ffffffffffffffe0 = (N_Vector)N_VMin(in_stack_ffffffffffffffe0);
    if ((double)in_stack_ffffffffffffffe0 < (double)local_18) {
      local_18 = in_stack_ffffffffffffffe0;
    }
  }
  return (sunrealtype)local_18;
}

Assistant:

sunrealtype N_VMin_SensWrapper(N_Vector x)
{
  int i;
  sunrealtype min, tmp;

  min = N_VMin(NV_VEC_SW(x, 0));

  for (i = 1; i < NV_NVECS_SW(x); i++)
  {
    tmp = N_VMin(NV_VEC_SW(x, i));
    if (tmp < min) { min = tmp; }
  }

  return (min);
}